

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::DecodeRemaining
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s,size_t start)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  string local_218;
  char local_1f1;
  size_t sStack_1f0;
  char c;
  size_t i;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [399];
  allocator<char> local_29;
  size_t local_28;
  size_t start_local;
  string *s_local;
  NumericCharacterEntity *this_local;
  
  local_28 = start;
  start_local = (size_t)s;
  s_local = (string *)this;
  this_local = (NumericCharacterEntity *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::__cxx11::string::substr((ulong)&i,(ulong)s);
    std::operator<<(local_1b8,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    sStack_1f0 = local_28;
    while( true ) {
      sStack_1f0 = sStack_1f0 + 1;
      uVar1 = sStack_1f0;
      uVar2 = std::__cxx11::string::length();
      if (uVar2 <= uVar1) break;
      pcVar3 = (char *)std::__cxx11::string::at((ulong)s);
      uVar1 = sStack_1f0;
      local_1f1 = *pcVar3;
      if ((local_1f1 == '&') && (lVar4 = std::__cxx11::string::length(), uVar1 < lVar4 - 3U)) {
        std::__cxx11::string::string((string *)&local_218,(string *)s);
        sStack_1f0 = NextDecodedChar(this,(stringstream *)local_1c8,&local_218,sStack_1f0);
        std::__cxx11::string::~string((string *)&local_218);
      }
      else {
        std::operator<<(local_1b8,local_1f1);
      }
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::DecodeRemaining(std::string s, size_t start)
{
    if (s.empty())
    {
        return "";
    }

    std::stringstream ss;
    ss << s.substr(0, start);

    for (size_t i = start + 1; i < s.length(); i++)
    {
        char c = s.at(i);

        if (c == '&' && i < s.length() - 3)
        {
            i = NextDecodedChar(ss, s, i);
        }
        else
        {
            ss << c;
        }
    }

    return ss.str();
}